

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.cc
# Opt level: O1

void __thiscall flow::MatchSame::MatchSame(MatchSame *this,MatchDef *def,Program *program)

{
  pointer pMVar1;
  mapped_type mVar2;
  MatchClass MVar3;
  undefined4 uVar4;
  mapped_type *pmVar5;
  MatchCaseDef *one;
  pointer pMVar6;
  
  (this->super_Match)._vptr_Match = (_func_int **)&PTR__Match_001b19d8;
  MVar3 = def->op;
  uVar4 = *(undefined4 *)&def->field_0xc;
  (this->super_Match).def_.handlerId = def->handlerId;
  (this->super_Match).def_.op = MVar3;
  *(undefined4 *)&(this->super_Match).def_.field_0xc = uVar4;
  (this->super_Match).def_.elsePC = def->elsePC;
  std::vector<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>::vector
            (&(this->super_Match).def_.cases,&def->cases);
  (this->super_Match)._vptr_Match = (_func_int **)&PTR__MatchSame_001b1a00;
  (this->map_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->map_)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->map_)._M_h._M_rehash_policy = 0;
  (this->map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->map_)._M_h._M_buckets = &(this->map_)._M_h._M_single_bucket;
  (this->map_)._M_h._M_bucket_count = 1;
  (this->map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->map_)._M_h._M_element_count = 0;
  (this->map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pMVar6 = (def->cases).super__Vector_base<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (def->cases).super__Vector_base<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pMVar6 != pMVar1) {
    do {
      mVar2 = pMVar6->pc;
      pmVar5 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->map_,
                            (program->cp_).strings_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + pMVar6->label);
      *pmVar5 = mVar2;
      pMVar6 = pMVar6 + 1;
    } while (pMVar6 != pMVar1);
  }
  return;
}

Assistant:

MatchSame::MatchSame(const MatchDef& def, Program* program)
    : Match(def),
      map_() {
  for (const auto& one : def.cases) {
    map_[program->constants().getString(one.label)] = one.pc;
  }
}